

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

size_t my_strcpy(char *buf,char *src,size_t bufsize)

{
  size_t sVar1;
  size_t __n;
  
  sVar1 = strlen(src);
  if (bufsize != 0) {
    __n = bufsize - 1;
    if (sVar1 < bufsize) {
      __n = sVar1;
    }
    memcpy(buf,src,__n);
    buf[__n] = '\0';
  }
  return sVar1;
}

Assistant:

size_t my_strcpy(char *buf, const char *src, size_t bufsize)
{
	size_t len = strlen(src);
	size_t ret = len;

	/* Paranoia */
	if (bufsize == 0) return ret;

	/* Truncate */
	if (len >= bufsize) len = bufsize - 1;

	/* Copy the string and terminate it */
	(void)memcpy(buf, src, len);
	buf[len] = '\0';

	/* Return strlen(src) */
	return ret;
}